

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<bool_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<bool_const&> *this,bool *rhs)

{
  bool *lhs;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  lest local_68 [32];
  result local_48;
  bool *local_20;
  bool *rhs_local;
  expression_lhs<const_bool_&> *this_local;
  
  local_48.passed = (**(byte **)this & 1) == (*rhs & 1U);
  lhs = *(bool **)this;
  local_20 = rhs;
  rhs_local = (bool *)this;
  this_local = (expression_lhs<const_bool_&> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"==",&local_a9);
  std::__cxx11::string::string(local_88,local_a8);
  to_string<bool,bool>(local_68,lhs,(string *)local_88,local_20);
  std::__cxx11::string::string((string *)&local_48.decomposition,(string *)local_68);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result{ lhs <= rhs, to_string( lhs, "<=", rhs ) }; }